

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O0

void __thiscall
n_e_s::core::Mapper2::Mapper2
          (Mapper2 *this,INesHeader *h,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *prg_rom,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *chr_mem)

{
  code *pcVar1;
  size_type sVar2;
  invalid_argument *piVar3;
  Mapper2 *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *chr_mem_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *prg_rom_local;
  INesHeader *h_local;
  Mapper2 *this_local;
  
  IRom::IRom(&this->super_IRom,h);
  (this->super_IRom)._vptr_IRom = (_func_int **)&PTR__Mapper2_00223888;
  this->select_bank_low_ = '\0';
  if (SBORROW4((uint)h->prg_rom_size,1)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this->select_bank_hi_ = h->prg_rom_size - 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->prg_rom_,prg_rom);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->chr_mem_,chr_mem);
  local_60 = (Mapper2 *)&this->nametables_;
  memset(local_60,0,0x800);
  do {
    local_60 = (Mapper2 *)((local_60->nametables_)._M_elems[0]._M_elems + 0x3b0);
  } while (local_60 != this + 1);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->prg_rom_);
  if (sVar2 != (ulong)h->prg_rom_size << 0xe) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Invalid prg_rom size");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->chr_mem_);
  if (sVar2 != 0x2000) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Invalid chr_ram size");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

Mapper2::Mapper2(const INesHeader &h,
        std::vector<uint8_t> prg_rom,
        std::vector<uint8_t> chr_mem)
        : IRom(h),
          select_bank_hi_(h.prg_rom_size - 1),
          prg_rom_(std::move(prg_rom)),
          chr_mem_(std::move(chr_mem)),
          nametables_{} {
    if (prg_rom_.size() !=
            static_cast<std::size_t>(16u * 1024u * h.prg_rom_size)) {
        throw std::invalid_argument("Invalid prg_rom size");
    }

    if (chr_mem_.size() != static_cast<std::size_t>(8u * 1024u)) {
        throw std::invalid_argument("Invalid chr_ram size");
    }
}